

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::MapReflectionTester::MapReflectionTester
          (MapReflectionTester *this,Descriptor *base_descriptor)

{
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  bool bVar1;
  FileDescriptor *pFVar2;
  EnumValueDescriptor *pEVar3;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  reference ppFVar6;
  Descriptor *pDVar7;
  LogMessage *pLVar8;
  char *in_R9;
  string_view sVar9;
  AssertHelper local_2580;
  Message local_2578;
  string local_2570 [32];
  unsigned_long local_2550;
  string local_2548 [32];
  unsigned_long local_2528;
  undefined1 local_2520 [8];
  AssertionResult gtest_ar_4;
  Message local_2508;
  string local_2500 [32];
  unsigned_long local_24e0;
  string local_24d8 [32];
  unsigned_long local_24b8;
  undefined1 local_24b0 [8];
  AssertionResult gtest_ar_3;
  Message local_2498;
  FieldDescriptor *local_2490;
  undefined1 local_2488 [8];
  AssertionResult gtest_ar_2;
  Message local_2470;
  string_view local_2468;
  undefined1 local_2458 [8];
  AssertionResult gtest_ar_1;
  Message local_2440;
  FieldDescriptor *local_2438;
  undefined1 local_2430 [8];
  AssertionResult gtest_ar;
  LogMessage local_23e8;
  Voidify local_23d1;
  FieldDescriptor *local_23d0;
  FieldDescriptor *fdesc;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  FieldDescriptor *local_23a8;
  FieldDescriptor *local_23a0;
  FieldDescriptor *local_2398;
  FieldDescriptor *local_2390;
  FieldDescriptor *local_2388;
  FieldDescriptor *local_2380;
  FieldDescriptor *local_2378;
  FieldDescriptor *local_2370;
  FieldDescriptor *local_2368;
  FieldDescriptor *local_2360;
  FieldDescriptor *local_2358;
  FieldDescriptor *local_2350;
  FieldDescriptor *local_2348;
  FieldDescriptor *local_2340;
  FieldDescriptor *local_2338;
  FieldDescriptor *local_2330;
  FieldDescriptor *local_2328;
  FieldDescriptor *local_2320;
  FieldDescriptor *local_2318;
  FieldDescriptor *local_2310;
  FieldDescriptor *local_2308;
  FieldDescriptor *local_2300;
  FieldDescriptor *local_22f8;
  FieldDescriptor *local_22f0;
  FieldDescriptor *local_22e8;
  FieldDescriptor *local_22e0;
  FieldDescriptor *local_22d8;
  FieldDescriptor *local_22d0;
  FieldDescriptor *local_22c8;
  FieldDescriptor *local_22c0;
  FieldDescriptor *local_22b8;
  FieldDescriptor *local_22b0;
  FieldDescriptor *local_22a8;
  FieldDescriptor *local_22a0;
  iterator local_2298;
  size_type local_2290;
  undefined1 local_2288 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  all_map_descriptors;
  AssertHelper local_2250;
  Message local_2248;
  bool local_2239;
  undefined1 local_2238 [8];
  AssertionResult gtest_ar__36;
  AssertHelper local_2208;
  Message local_2200;
  bool local_21f1;
  undefined1 local_21f0 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_21c0;
  Message local_21b8;
  bool local_21a9;
  undefined1 local_21a8 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_2178;
  Message local_2170;
  bool local_2161;
  undefined1 local_2160 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_2130;
  Message local_2128;
  bool local_2119;
  undefined1 local_2118 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_20e8;
  Message local_20e0;
  bool local_20d1;
  undefined1 local_20d0 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_20a0;
  Message local_2098;
  bool local_2089;
  undefined1 local_2088 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_2058;
  Message local_2050;
  bool local_2041;
  undefined1 local_2040 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_2010;
  Message local_2008;
  bool local_1ff9;
  undefined1 local_1ff8 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_1fc8;
  Message local_1fc0;
  bool local_1fb1;
  undefined1 local_1fb0 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1f80;
  Message local_1f78;
  bool local_1f69;
  undefined1 local_1f68 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_1f38;
  Message local_1f30;
  bool local_1f21;
  undefined1 local_1f20 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_1ef0;
  Message local_1ee8;
  bool local_1ed9;
  undefined1 local_1ed8 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_1ea8;
  Message local_1ea0;
  bool local_1e91;
  undefined1 local_1e90 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_1e60;
  Message local_1e58;
  bool local_1e49;
  undefined1 local_1e48 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_1e18;
  Message local_1e10;
  bool local_1e01;
  undefined1 local_1e00 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_1dd0;
  Message local_1dc8;
  bool local_1db9;
  undefined1 local_1db8 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_1d88;
  Message local_1d80;
  bool local_1d71;
  undefined1 local_1d70 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_1d40;
  Message local_1d38;
  bool local_1d29;
  undefined1 local_1d28 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1cf8;
  Message local_1cf0;
  bool local_1ce1;
  undefined1 local_1ce0 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_1cb0;
  Message local_1ca8;
  bool local_1c99;
  undefined1 local_1c98 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_1c68;
  Message local_1c60;
  bool local_1c51;
  undefined1 local_1c50 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_1c20;
  Message local_1c18;
  bool local_1c09;
  undefined1 local_1c08 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_1bd8;
  Message local_1bd0;
  bool local_1bc1;
  undefined1 local_1bc0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_1b90;
  Message local_1b88;
  bool local_1b79;
  undefined1 local_1b78 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1b48;
  Message local_1b40;
  bool local_1b31;
  undefined1 local_1b30 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_1b00;
  Message local_1af8;
  bool local_1ae9;
  undefined1 local_1ae8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_1ab8;
  Message local_1ab0;
  bool local_1aa1;
  undefined1 local_1aa0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_1a70;
  Message local_1a68;
  bool local_1a59;
  undefined1 local_1a58 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_1a28;
  Message local_1a20;
  bool local_1a11;
  undefined1 local_1a10 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_19e0;
  Message local_19d8;
  bool local_19c9;
  undefined1 local_19c8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1998;
  Message local_1990;
  bool local_1981;
  undefined1 local_1980 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1950;
  Message local_1948;
  bool local_1939;
  undefined1 local_1938 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1908;
  Message local_1900;
  bool local_18f1;
  undefined1 local_18f0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_18c0;
  Message local_18b8;
  bool local_18a9;
  undefined1 local_18a8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1878;
  Message local_1870;
  bool local_1861;
  undefined1 local_1860 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1830;
  Message local_1828;
  bool local_1819;
  undefined1 local_1818 [8];
  AssertionResult gtest_ar_;
  AlphaNum local_17c8;
  string local_1798;
  string_view local_1778;
  AlphaNum local_1768;
  size_t local_1738;
  size_t sStack_1730;
  AlphaNum local_1728;
  string local_16f8;
  string_view local_16d8;
  AlphaNum local_16c8;
  size_t local_1698;
  size_t sStack_1690;
  AlphaNum local_1688;
  string local_1658;
  string_view local_1638;
  AlphaNum local_1628;
  size_t local_15f8;
  size_t sStack_15f0;
  AlphaNum local_15e8;
  string local_15b8;
  string_view local_1598;
  AlphaNum local_1588;
  size_t local_1558;
  size_t sStack_1550;
  AlphaNum local_1548;
  string local_1518;
  string_view local_14f8;
  AlphaNum local_14e8;
  size_t local_14b8;
  size_t sStack_14b0;
  AlphaNum local_14a8;
  string local_1478;
  string_view local_1458;
  AlphaNum local_1448;
  size_t local_1418;
  size_t sStack_1410;
  AlphaNum local_1408;
  string local_13d8;
  string_view local_13b8;
  AlphaNum local_13a8;
  size_t local_1378;
  size_t sStack_1370;
  AlphaNum local_1368;
  string local_1338;
  string_view local_1318;
  AlphaNum local_1308;
  size_t local_12d8;
  size_t sStack_12d0;
  AlphaNum local_12c8;
  string local_1298;
  string_view local_1278;
  AlphaNum local_1268;
  size_t local_1238;
  size_t sStack_1230;
  AlphaNum local_1228;
  string local_11f8;
  string_view local_11d8;
  AlphaNum local_11c8;
  size_t local_1198;
  size_t sStack_1190;
  AlphaNum local_1188;
  string local_1158;
  string_view local_1138;
  AlphaNum local_1128;
  size_t local_10f8;
  size_t sStack_10f0;
  AlphaNum local_10e8;
  string local_10b8;
  string_view local_1098;
  AlphaNum local_1088;
  size_t local_1058;
  size_t sStack_1050;
  AlphaNum local_1048;
  string local_1018;
  string_view local_ff8;
  AlphaNum local_fe8;
  size_t local_fb8;
  size_t sStack_fb0;
  AlphaNum local_fa8;
  string local_f78;
  string_view local_f58;
  AlphaNum local_f48;
  size_t local_f18;
  size_t sStack_f10;
  AlphaNum local_f08;
  string local_ed8;
  string_view local_eb8;
  AlphaNum local_ea8;
  size_t local_e78;
  size_t sStack_e70;
  AlphaNum local_e68;
  string local_e38;
  string_view local_e18;
  AlphaNum local_e08;
  size_t local_dd8;
  size_t sStack_dd0;
  AlphaNum local_dc8;
  string local_d98;
  string_view local_d78;
  AlphaNum local_d68;
  size_t local_d38;
  size_t sStack_d30;
  AlphaNum local_d28;
  string local_cf8;
  string_view local_cd8;
  AlphaNum local_cc8;
  size_t local_c98;
  size_t sStack_c90;
  AlphaNum local_c88;
  string local_c58;
  string_view local_c38;
  AlphaNum local_c28;
  size_t local_bf8;
  size_t sStack_bf0;
  AlphaNum local_be8;
  string local_bb8;
  string_view local_b98;
  AlphaNum local_b88;
  size_t local_b58;
  size_t sStack_b50;
  AlphaNum local_b48;
  string local_b18;
  string_view local_af8;
  AlphaNum local_ae8;
  size_t local_ab8;
  size_t sStack_ab0;
  AlphaNum local_aa8;
  string local_a78;
  string_view local_a58;
  AlphaNum local_a48;
  size_t local_a18;
  size_t sStack_a10;
  AlphaNum local_a08;
  string local_9d8;
  string_view local_9b8;
  AlphaNum local_9a8;
  size_t local_978;
  size_t sStack_970;
  AlphaNum local_968;
  string local_938;
  string_view local_918;
  AlphaNum local_908;
  size_t local_8d8;
  size_t sStack_8d0;
  AlphaNum local_8c8;
  string local_898;
  string_view local_878;
  AlphaNum local_868;
  size_t local_838;
  size_t sStack_830;
  AlphaNum local_828;
  string local_7f8;
  string_view local_7d8;
  AlphaNum local_7c8;
  size_t local_798;
  size_t sStack_790;
  AlphaNum local_788;
  string local_758;
  string_view local_738;
  AlphaNum local_728;
  size_t local_6f8;
  size_t sStack_6f0;
  AlphaNum local_6e8;
  string local_6b8;
  string_view local_698;
  AlphaNum local_688;
  size_t local_658;
  size_t sStack_650;
  AlphaNum local_648;
  string local_618;
  string_view local_5f8;
  AlphaNum local_5e8;
  size_t local_5b8;
  size_t sStack_5b0;
  AlphaNum local_5a8;
  string local_578;
  string_view local_558;
  AlphaNum local_548;
  size_t local_518;
  size_t sStack_510;
  AlphaNum local_508;
  string local_4d8;
  string_view local_4b8;
  AlphaNum local_4a8;
  size_t local_478;
  size_t sStack_470;
  AlphaNum local_468;
  string local_438;
  string_view local_418;
  AlphaNum local_408;
  size_t local_3d8;
  size_t sStack_3d0;
  AlphaNum local_3c8;
  string local_398;
  string_view local_378;
  AlphaNum local_368;
  size_t local_338;
  size_t sStack_330;
  AlphaNum local_328;
  string local_2f8;
  string_view local_2d8;
  AlphaNum local_2c8;
  size_t local_298;
  size_t sStack_290;
  AlphaNum local_288;
  string local_258;
  string_view local_238;
  AlphaNum local_228;
  size_t local_1f8;
  size_t sStack_1f0;
  AlphaNum local_1e8;
  string local_1b8;
  string_view local_198;
  AlphaNum local_188;
  size_t local_158;
  size_t sStack_150;
  AlphaNum local_148;
  string local_118;
  string_view local_f8;
  AlphaNum local_d8;
  size_t local_a8;
  size_t sStack_a0;
  AlphaNum local_90;
  string local_60;
  string_view local_40;
  undefined1 auStack_30 [8];
  string_view package;
  DescriptorPool *pool;
  Descriptor *base_descriptor_local;
  MapReflectionTester *this_local;
  
  this->base_descriptor_ = base_descriptor;
  pDVar7 = base_descriptor;
  pFVar2 = Descriptor::file(base_descriptor);
  package._M_str = (char *)FileDescriptor::pool(pFVar2);
  pFVar2 = Descriptor::file(base_descriptor);
  _auStack_30 = FileDescriptor::package(pFVar2);
  pcVar5 = package._M_str;
  local_a8 = (size_t)auStack_30;
  sStack_a0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,".MAP_ENUM_FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_60,(lts_20250127 *)&local_90,&local_d8,(AlphaNum *)pDVar7);
  local_40 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  pEVar3 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_40);
  this->map_enum_foo_ = pEVar3;
  std::__cxx11::string::~string((string *)&local_60);
  pcVar5 = package._M_str;
  local_158 = (size_t)auStack_30;
  sStack_150 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_148,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_188,".MAP_ENUM_BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_118,(lts_20250127 *)&local_148,&local_188,(AlphaNum *)pEVar3);
  local_f8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_118);
  pEVar3 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_f8);
  this->map_enum_bar_ = pEVar3;
  std::__cxx11::string::~string((string *)&local_118);
  pcVar5 = package._M_str;
  local_1f8 = (size_t)auStack_30;
  sStack_1f0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1e8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_228,".MAP_ENUM_BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1b8,(lts_20250127 *)&local_1e8,&local_228,(AlphaNum *)pEVar3);
  local_198 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1b8);
  pEVar3 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_198);
  this->map_enum_baz_ = pEVar3;
  std::__cxx11::string::~string((string *)&local_1b8);
  pcVar5 = package._M_str;
  local_298 = (size_t)auStack_30;
  sStack_290 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_288,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2c8,".ForeignMessage.c");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_258,(lts_20250127 *)&local_288,&local_2c8,(AlphaNum *)pEVar3);
  local_238 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_258);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_238);
  this->foreign_c_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_258);
  pcVar5 = package._M_str;
  local_338 = (size_t)auStack_30;
  sStack_330 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_328,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_368,".TestMap.MapInt32Int32Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_2f8,(lts_20250127 *)&local_328,&local_368,(AlphaNum *)pFVar4);
  local_2d8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2f8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_2d8);
  this->map_int32_int32_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_2f8);
  pcVar5 = package._M_str;
  local_3d8 = (size_t)auStack_30;
  sStack_3d0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_3c8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_408,".TestMap.MapInt32Int32Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_398,(lts_20250127 *)&local_3c8,&local_408,(AlphaNum *)pFVar4);
  local_378 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_398);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_378);
  this->map_int32_int32_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_398);
  pcVar5 = package._M_str;
  local_478 = (size_t)auStack_30;
  sStack_470 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_468,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_4a8,".TestMap.MapInt64Int64Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_438,(lts_20250127 *)&local_468,&local_4a8,(AlphaNum *)pFVar4);
  local_418 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_438);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_418);
  this->map_int64_int64_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_438);
  pcVar5 = package._M_str;
  local_518 = (size_t)auStack_30;
  sStack_510 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_508,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_548,".TestMap.MapInt64Int64Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_4d8,(lts_20250127 *)&local_508,&local_548,(AlphaNum *)pFVar4);
  local_4b8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4d8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_4b8);
  this->map_int64_int64_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_4d8);
  pcVar5 = package._M_str;
  local_5b8 = (size_t)auStack_30;
  sStack_5b0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_5a8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_5e8,".TestMap.MapUint32Uint32Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_578,(lts_20250127 *)&local_5a8,&local_5e8,(AlphaNum *)pFVar4);
  local_558 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_578);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_558);
  this->map_uint32_uint32_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_578);
  pcVar5 = package._M_str;
  local_658 = (size_t)auStack_30;
  sStack_650 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_648,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_688,".TestMap.MapUint32Uint32Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_618,(lts_20250127 *)&local_648,&local_688,(AlphaNum *)pFVar4);
  local_5f8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_618);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_5f8);
  this->map_uint32_uint32_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_618);
  pcVar5 = package._M_str;
  local_6f8 = (size_t)auStack_30;
  sStack_6f0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_6e8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_728,".TestMap.MapUint64Uint64Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_6b8,(lts_20250127 *)&local_6e8,&local_728,(AlphaNum *)pFVar4);
  local_698 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_6b8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_698);
  this->map_uint64_uint64_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_6b8);
  pcVar5 = package._M_str;
  local_798 = (size_t)auStack_30;
  sStack_790 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_788,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_7c8,".TestMap.MapUint64Uint64Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_758,(lts_20250127 *)&local_788,&local_7c8,(AlphaNum *)pFVar4);
  local_738 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_758);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_738);
  this->map_uint64_uint64_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_758);
  pcVar5 = package._M_str;
  local_838 = (size_t)auStack_30;
  sStack_830 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_828,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_868,".TestMap.MapSint32Sint32Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_7f8,(lts_20250127 *)&local_828,&local_868,(AlphaNum *)pFVar4);
  local_7d8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_7f8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_7d8);
  this->map_sint32_sint32_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_7f8);
  pcVar5 = package._M_str;
  local_8d8 = (size_t)auStack_30;
  sStack_8d0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_8c8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_908,".TestMap.MapSint32Sint32Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_898,(lts_20250127 *)&local_8c8,&local_908,(AlphaNum *)pFVar4);
  local_878 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_898);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_878);
  this->map_sint32_sint32_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_898);
  pcVar5 = package._M_str;
  local_978 = (size_t)auStack_30;
  sStack_970 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_968,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_9a8,".TestMap.MapSint64Sint64Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_938,(lts_20250127 *)&local_968,&local_9a8,(AlphaNum *)pFVar4);
  local_918 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_938);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_918);
  this->map_sint64_sint64_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_938);
  pcVar5 = package._M_str;
  local_a18 = (size_t)auStack_30;
  sStack_a10 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a08,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a48,".TestMap.MapSint64Sint64Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_9d8,(lts_20250127 *)&local_a08,&local_a48,(AlphaNum *)pFVar4);
  local_9b8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_9d8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_9b8);
  this->map_sint64_sint64_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_9d8);
  pcVar5 = package._M_str;
  local_ab8 = (size_t)auStack_30;
  sStack_ab0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_aa8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_ae8,".TestMap.MapFixed32Fixed32Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_a78,(lts_20250127 *)&local_aa8,&local_ae8,(AlphaNum *)pFVar4);
  local_a58 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a78);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_a58);
  this->map_fixed32_fixed32_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_a78);
  pcVar5 = package._M_str;
  local_b58 = (size_t)auStack_30;
  sStack_b50 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b48,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b88,".TestMap.MapFixed32Fixed32Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b18,(lts_20250127 *)&local_b48,&local_b88,(AlphaNum *)pFVar4);
  local_af8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b18);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_af8);
  this->map_fixed32_fixed32_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_b18);
  pcVar5 = package._M_str;
  local_bf8 = (size_t)auStack_30;
  sStack_bf0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_be8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c28,".TestMap.MapFixed64Fixed64Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_bb8,(lts_20250127 *)&local_be8,&local_c28,(AlphaNum *)pFVar4);
  local_b98 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_bb8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_b98);
  this->map_fixed64_fixed64_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_bb8);
  pcVar5 = package._M_str;
  local_c98 = (size_t)auStack_30;
  sStack_c90 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c88,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_cc8,".TestMap.MapFixed64Fixed64Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_c58,(lts_20250127 *)&local_c88,&local_cc8,(AlphaNum *)pFVar4);
  local_c38 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c58);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_c38);
  this->map_fixed64_fixed64_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_c58);
  pcVar5 = package._M_str;
  local_d38 = (size_t)auStack_30;
  sStack_d30 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d28,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d68,".TestMap.MapSfixed32Sfixed32Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_cf8,(lts_20250127 *)&local_d28,&local_d68,(AlphaNum *)pFVar4);
  local_cd8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_cf8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_cd8);
  this->map_sfixed32_sfixed32_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_cf8);
  pcVar5 = package._M_str;
  local_dd8 = (size_t)auStack_30;
  sStack_dd0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_dc8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e08,".TestMap.MapSfixed32Sfixed32Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d98,(lts_20250127 *)&local_dc8,&local_e08,(AlphaNum *)pFVar4);
  local_d78 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d98);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_d78);
  this->map_sfixed32_sfixed32_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_d98);
  pcVar5 = package._M_str;
  local_e78 = (size_t)auStack_30;
  sStack_e70 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e68,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_ea8,".TestMap.MapSfixed64Sfixed64Entry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_e38,(lts_20250127 *)&local_e68,&local_ea8,(AlphaNum *)pFVar4);
  local_e18 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e38);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_e18);
  this->map_sfixed64_sfixed64_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_e38);
  pcVar5 = package._M_str;
  local_f18 = (size_t)auStack_30;
  sStack_f10 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f08,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f48,".TestMap.MapSfixed64Sfixed64Entry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_ed8,(lts_20250127 *)&local_f08,&local_f48,(AlphaNum *)pFVar4);
  local_eb8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_ed8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_eb8);
  this->map_sfixed64_sfixed64_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_ed8);
  pcVar5 = package._M_str;
  local_fb8 = (size_t)auStack_30;
  sStack_fb0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_fa8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_fe8,".TestMap.MapInt32FloatEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_f78,(lts_20250127 *)&local_fa8,&local_fe8,(AlphaNum *)pFVar4);
  local_f58 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f78);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_f58);
  this->map_int32_float_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_f78);
  pcVar5 = package._M_str;
  local_1058 = (size_t)auStack_30;
  sStack_1050 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1048,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1088,".TestMap.MapInt32FloatEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1018,(lts_20250127 *)&local_1048,&local_1088,(AlphaNum *)pFVar4);
  local_ff8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1018);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_ff8);
  this->map_int32_float_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1018);
  pcVar5 = package._M_str;
  local_10f8 = (size_t)auStack_30;
  sStack_10f0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_10e8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1128,".TestMap.MapInt32DoubleEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_10b8,(lts_20250127 *)&local_10e8,&local_1128,(AlphaNum *)pFVar4);
  local_1098 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_10b8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1098);
  this->map_int32_double_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_10b8);
  pcVar5 = package._M_str;
  local_1198 = (size_t)auStack_30;
  sStack_1190 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1188,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_11c8,".TestMap.MapInt32DoubleEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1158,(lts_20250127 *)&local_1188,&local_11c8,(AlphaNum *)pFVar4);
  local_1138 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1158);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1138);
  this->map_int32_double_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1158);
  pcVar5 = package._M_str;
  local_1238 = (size_t)auStack_30;
  sStack_1230 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1228,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1268,".TestMap.MapBoolBoolEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_11f8,(lts_20250127 *)&local_1228,&local_1268,(AlphaNum *)pFVar4);
  local_11d8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_11f8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_11d8);
  this->map_bool_bool_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_11f8);
  pcVar5 = package._M_str;
  local_12d8 = (size_t)auStack_30;
  sStack_12d0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_12c8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1308,".TestMap.MapBoolBoolEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1298,(lts_20250127 *)&local_12c8,&local_1308,(AlphaNum *)pFVar4);
  local_1278 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1298);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1278);
  this->map_bool_bool_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1298);
  pcVar5 = package._M_str;
  local_1378 = (size_t)auStack_30;
  sStack_1370 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1368,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_13a8,".TestMap.MapStringStringEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1338,(lts_20250127 *)&local_1368,&local_13a8,(AlphaNum *)pFVar4);
  local_1318 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1338);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1318);
  this->map_string_string_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1338);
  pcVar5 = package._M_str;
  local_1418 = (size_t)auStack_30;
  sStack_1410 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1408,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1448,".TestMap.MapStringStringEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_13d8,(lts_20250127 *)&local_1408,&local_1448,(AlphaNum *)pFVar4);
  local_13b8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_13d8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_13b8);
  this->map_string_string_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_13d8);
  pcVar5 = package._M_str;
  local_14b8 = (size_t)auStack_30;
  sStack_14b0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_14a8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_14e8,".TestMap.MapInt32BytesEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1478,(lts_20250127 *)&local_14a8,&local_14e8,(AlphaNum *)pFVar4);
  local_1458 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1478);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1458);
  this->map_int32_bytes_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1478);
  pcVar5 = package._M_str;
  local_1558 = (size_t)auStack_30;
  sStack_1550 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1548,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1588,".TestMap.MapInt32BytesEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1518,(lts_20250127 *)&local_1548,&local_1588,(AlphaNum *)pFVar4);
  local_14f8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1518);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_14f8);
  this->map_int32_bytes_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1518);
  pcVar5 = package._M_str;
  local_15f8 = (size_t)auStack_30;
  sStack_15f0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_15e8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1628,".TestMap.MapInt32EnumEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_15b8,(lts_20250127 *)&local_15e8,&local_1628,(AlphaNum *)pFVar4);
  local_1598 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_15b8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1598);
  this->map_int32_enum_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_15b8);
  pcVar5 = package._M_str;
  local_1698 = (size_t)auStack_30;
  sStack_1690 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1688,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_16c8,".TestMap.MapInt32EnumEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1658,(lts_20250127 *)&local_1688,&local_16c8,(AlphaNum *)pFVar4);
  local_1638 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1658);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1638);
  this->map_int32_enum_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1658);
  pcVar5 = package._M_str;
  local_1738 = (size_t)auStack_30;
  sStack_1730 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1728,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1768,".TestMap.MapInt32ForeignMessageEntry.key");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_16f8,(lts_20250127 *)&local_1728,&local_1768,(AlphaNum *)pFVar4);
  local_16d8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_16f8);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_16d8);
  this->map_int32_foreign_message_key_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_16f8);
  pcVar5 = package._M_str;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_17c8,_auStack_30);
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)&gtest_ar_.message_,".TestMap.MapInt32ForeignMessageEntry.value");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1798,(lts_20250127 *)&local_17c8,(AlphaNum *)&gtest_ar_.message_,
             (AlphaNum *)pFVar4);
  local_1778 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1798);
  pFVar4 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1778);
  this->map_int32_foreign_message_val_ = pFVar4;
  std::__cxx11::string::~string((string *)&local_1798);
  local_1819 = this->map_enum_foo_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1818,&local_1819,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1818);
  if (!bVar1) {
    testing::Message::Message(&local_1828);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1818,
               (AssertionResult *)"map_enum_foo_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1830,&local_1828);
    testing::internal::AssertHelper::~AssertHelper(&local_1830);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1818);
  local_1861 = this->map_enum_bar_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1860,&local_1861,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1860);
  if (!bVar1) {
    testing::Message::Message(&local_1870);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1860,
               (AssertionResult *)"map_enum_bar_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1878,&local_1870);
    testing::internal::AssertHelper::~AssertHelper(&local_1878);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1860);
  local_18a9 = this->map_enum_baz_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_18a8,&local_18a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18a8);
  if (!bVar1) {
    testing::Message::Message(&local_18b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_18a8,
               (AssertionResult *)"map_enum_baz_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_18c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_18c0,&local_18b8);
    testing::internal::AssertHelper::~AssertHelper(&local_18c0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_18b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18a8);
  local_18f1 = this->map_int32_int32_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_18f0,&local_18f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18f0);
  if (!bVar1) {
    testing::Message::Message(&local_1900);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_18f0,
               (AssertionResult *)"map_int32_int32_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1908,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1908,&local_1900);
    testing::internal::AssertHelper::~AssertHelper(&local_1908);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18f0);
  local_1939 = this->map_int32_int32_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1938,&local_1939,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1938);
  if (!bVar1) {
    testing::Message::Message(&local_1948);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1938,
               (AssertionResult *)"map_int32_int32_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1950,&local_1948);
    testing::internal::AssertHelper::~AssertHelper(&local_1950);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1938);
  local_1981 = this->map_int64_int64_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1980,&local_1981,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1980);
  if (!bVar1) {
    testing::Message::Message(&local_1990);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1980,
               (AssertionResult *)"map_int64_int64_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x6f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1998,&local_1990);
    testing::internal::AssertHelper::~AssertHelper(&local_1998);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1980);
  local_19c9 = this->map_int64_int64_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19c8,&local_19c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19c8);
  if (!bVar1) {
    testing::Message::Message(&local_19d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_19c8,
               (AssertionResult *)"map_int64_int64_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x70,pcVar5);
    testing::internal::AssertHelper::operator=(&local_19e0,&local_19d8);
    testing::internal::AssertHelper::~AssertHelper(&local_19e0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_19d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19c8);
  local_1a11 = this->map_uint32_uint32_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a10,&local_1a11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a10);
  if (!bVar1) {
    testing::Message::Message(&local_1a20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_1a10,
               (AssertionResult *)"map_uint32_uint32_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x71,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1a28,&local_1a20);
    testing::internal::AssertHelper::~AssertHelper(&local_1a28);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a10);
  local_1a59 = this->map_uint32_uint32_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a58,&local_1a59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a58);
  if (!bVar1) {
    testing::Message::Message(&local_1a68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_1a58,
               (AssertionResult *)"map_uint32_uint32_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x72,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1a70,&local_1a68);
    testing::internal::AssertHelper::~AssertHelper(&local_1a70);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a58);
  local_1aa1 = this->map_uint64_uint64_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1aa0,&local_1aa1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa0);
  if (!bVar1) {
    testing::Message::Message(&local_1ab0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1aa0,
               (AssertionResult *)"map_uint64_uint64_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x73,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1ab8,&local_1ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ab8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_1ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa0);
  local_1ae9 = this->map_uint64_uint64_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ae8,&local_1ae9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ae8);
  if (!bVar1) {
    testing::Message::Message(&local_1af8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_1ae8,
               (AssertionResult *)"map_uint64_uint64_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x74,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1b00,&local_1af8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b00);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_1af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ae8);
  local_1b31 = this->map_sint32_sint32_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b30,&local_1b31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b30);
  if (!bVar1) {
    testing::Message::Message(&local_1b40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1b30,
               (AssertionResult *)"map_sint32_sint32_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x75,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1b48,&local_1b40);
    testing::internal::AssertHelper::~AssertHelper(&local_1b48);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_1b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b30);
  local_1b79 = this->map_sint32_sint32_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b78,&local_1b79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b78);
  if (!bVar1) {
    testing::Message::Message(&local_1b88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_1b78,
               (AssertionResult *)"map_sint32_sint32_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x76,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1b90,&local_1b88);
    testing::internal::AssertHelper::~AssertHelper(&local_1b90);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_1b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b78);
  local_1bc1 = this->map_sint64_sint64_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1bc0,&local_1bc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bc0);
  if (!bVar1) {
    testing::Message::Message(&local_1bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_1bc0,
               (AssertionResult *)"map_sint64_sint64_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1bd8,&local_1bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_1bd8);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_1bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bc0);
  local_1c09 = this->map_sint64_sint64_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c08,&local_1c09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c08);
  if (!bVar1) {
    testing::Message::Message(&local_1c18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_1c08,
               (AssertionResult *)"map_sint64_sint64_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x78,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1c20,&local_1c18);
    testing::internal::AssertHelper::~AssertHelper(&local_1c20);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_1c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c08);
  local_1c51 = this->map_fixed32_fixed32_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c50,&local_1c51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c50);
  if (!bVar1) {
    testing::Message::Message(&local_1c60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_1c50,
               (AssertionResult *)"map_fixed32_fixed32_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x79,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1c68,&local_1c60);
    testing::internal::AssertHelper::~AssertHelper(&local_1c68);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_1c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c50);
  local_1c99 = this->map_fixed32_fixed32_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c98,&local_1c99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c98);
  if (!bVar1) {
    testing::Message::Message(&local_1ca8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_1c98,
               (AssertionResult *)"map_fixed32_fixed32_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1cb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1cb0,&local_1ca8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cb0);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c98);
  local_1ce1 = this->map_fixed64_fixed64_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ce0,&local_1ce1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ce0);
  if (!bVar1) {
    testing::Message::Message(&local_1cf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1ce0,
               (AssertionResult *)"map_fixed64_fixed64_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1cf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1cf8,&local_1cf0);
    testing::internal::AssertHelper::~AssertHelper(&local_1cf8);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1cf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ce0);
  local_1d29 = this->map_fixed64_fixed64_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d28,&local_1d29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d28);
  if (!bVar1) {
    testing::Message::Message(&local_1d38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_1d28,
               (AssertionResult *)"map_fixed64_fixed64_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1d40,&local_1d38);
    testing::internal::AssertHelper::~AssertHelper(&local_1d40);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1d38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d28);
  local_1d71 = this->map_sfixed32_sfixed32_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d70,&local_1d71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d70);
  if (!bVar1) {
    testing::Message::Message(&local_1d80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_1d70,
               (AssertionResult *)"map_sfixed32_sfixed32_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1d88,&local_1d80);
    testing::internal::AssertHelper::~AssertHelper(&local_1d88);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_1d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d70);
  local_1db9 = this->map_sfixed32_sfixed32_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1db8,&local_1db9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1db8);
  if (!bVar1) {
    testing::Message::Message(&local_1dc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_1db8,
               (AssertionResult *)"map_sfixed32_sfixed32_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1dd0,&local_1dc8);
    testing::internal::AssertHelper::~AssertHelper(&local_1dd0);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_1dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1db8);
  local_1e01 = this->map_sfixed64_sfixed64_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e00,&local_1e01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e00);
  if (!bVar1) {
    testing::Message::Message(&local_1e10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_1e00,
               (AssertionResult *)"map_sfixed64_sfixed64_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x7f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1e18,&local_1e10);
    testing::internal::AssertHelper::~AssertHelper(&local_1e18);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_1e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e00);
  local_1e49 = this->map_sfixed64_sfixed64_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e48,&local_1e49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e48);
  if (!bVar1) {
    testing::Message::Message(&local_1e58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_1e48,
               (AssertionResult *)"map_sfixed64_sfixed64_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x80,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1e60,&local_1e58);
    testing::internal::AssertHelper::~AssertHelper(&local_1e60);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e48);
  local_1e91 = this->map_int32_float_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e90,&local_1e91,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e90);
  if (!bVar1) {
    testing::Message::Message(&local_1ea0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_1e90,
               (AssertionResult *)"map_int32_float_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x81,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1ea8,&local_1ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ea8);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e90);
  local_1ed9 = this->map_int32_float_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ed8,&local_1ed9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ed8);
  if (!bVar1) {
    testing::Message::Message(&local_1ee8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_1ed8,
               (AssertionResult *)"map_int32_float_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x82,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1ef0,&local_1ee8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ef0);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_1ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ed8);
  local_1f21 = this->map_int32_double_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f20,&local_1f21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f20);
  if (!bVar1) {
    testing::Message::Message(&local_1f30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_1f20,
               (AssertionResult *)"map_int32_double_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x83,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1f38,&local_1f30);
    testing::internal::AssertHelper::~AssertHelper(&local_1f38);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_1f30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f20);
  local_1f69 = this->map_int32_double_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f68,&local_1f69,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f68);
  if (!bVar1) {
    testing::Message::Message(&local_1f78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_1f68,
               (AssertionResult *)"map_int32_double_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x84,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1f80,&local_1f78);
    testing::internal::AssertHelper::~AssertHelper(&local_1f80);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_1f78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f68);
  local_1fb1 = this->map_bool_bool_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1fb0,&local_1fb1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fb0);
  if (!bVar1) {
    testing::Message::Message(&local_1fc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_1fb0,
               (AssertionResult *)"map_bool_bool_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x85,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1fc8,&local_1fc0);
    testing::internal::AssertHelper::~AssertHelper(&local_1fc8);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_1fc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fb0);
  local_1ff9 = this->map_bool_bool_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ff8,&local_1ff9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ff8);
  if (!bVar1) {
    testing::Message::Message(&local_2008);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_1ff8,
               (AssertionResult *)"map_bool_bool_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2010,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x86,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2010,&local_2008);
    testing::internal::AssertHelper::~AssertHelper(&local_2010);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_2008);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ff8);
  local_2041 = this->map_string_string_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2040,&local_2041,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2040);
  if (!bVar1) {
    testing::Message::Message(&local_2050);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_2040,
               (AssertionResult *)"map_string_string_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2058,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x87,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2058,&local_2050);
    testing::internal::AssertHelper::~AssertHelper(&local_2058);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_2050);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2040);
  local_2089 = this->map_string_string_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2088,&local_2089,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2088);
  if (!bVar1) {
    testing::Message::Message(&local_2098);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_2088,
               (AssertionResult *)"map_string_string_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_20a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x88,pcVar5);
    testing::internal::AssertHelper::operator=(&local_20a0,&local_2098);
    testing::internal::AssertHelper::~AssertHelper(&local_20a0);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_2098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2088);
  local_20d1 = this->map_int32_bytes_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_20d0,&local_20d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20d0);
  if (!bVar1) {
    testing::Message::Message(&local_20e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_20d0,
               (AssertionResult *)"map_int32_bytes_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_20e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x89,pcVar5);
    testing::internal::AssertHelper::operator=(&local_20e8,&local_20e0);
    testing::internal::AssertHelper::~AssertHelper(&local_20e8);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_20e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20d0);
  local_2119 = this->map_int32_bytes_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2118,&local_2119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2118);
  if (!bVar1) {
    testing::Message::Message(&local_2128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_2118,
               (AssertionResult *)"map_int32_bytes_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2130,&local_2128);
    testing::internal::AssertHelper::~AssertHelper(&local_2130);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_2128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2118);
  local_2161 = this->map_int32_enum_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2160,&local_2161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2160);
  if (!bVar1) {
    testing::Message::Message(&local_2170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_2160,
               (AssertionResult *)"map_int32_enum_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2178,&local_2170);
    testing::internal::AssertHelper::~AssertHelper(&local_2178);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_2170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2160);
  local_21a9 = this->map_int32_enum_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_21a8,&local_21a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21a8);
  if (!bVar1) {
    testing::Message::Message(&local_21b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__35.message_,(internal *)local_21a8,
               (AssertionResult *)"map_int32_enum_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_21c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_21c0,&local_21b8);
    testing::internal::AssertHelper::~AssertHelper(&local_21c0);
    std::__cxx11::string::~string((string *)&gtest_ar__35.message_);
    testing::Message::~Message(&local_21b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_21a8);
  local_21f1 = this->map_int32_foreign_message_key_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_21f0,&local_21f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21f0);
  if (!bVar1) {
    testing::Message::Message(&local_2200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__36.message_,(internal *)local_21f0,
               (AssertionResult *)"map_int32_foreign_message_key_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2208,&local_2200);
    testing::internal::AssertHelper::~AssertHelper(&local_2208);
    std::__cxx11::string::~string((string *)&gtest_ar__36.message_);
    testing::Message::~Message(&local_2200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_21f0);
  local_2239 = this->map_int32_foreign_message_val_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2238,&local_2239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2238);
  if (!bVar1) {
    testing::Message::Message(&local_2248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &all_map_descriptors.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_2238,
               (AssertionResult *)"map_int32_foreign_message_val_ == nullptr","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x8e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2250,&local_2248);
    testing::internal::AssertHelper::~AssertHelper(&local_2250);
    std::__cxx11::string::~string
              ((string *)
               &all_map_descriptors.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2238);
  local_23a8 = this->map_int32_int32_key_;
  local_23a0 = this->map_int32_int32_val_;
  local_2398 = this->map_int64_int64_key_;
  local_2390 = this->map_int64_int64_val_;
  local_2388 = this->map_uint32_uint32_key_;
  local_2380 = this->map_uint32_uint32_val_;
  local_2378 = this->map_uint64_uint64_key_;
  local_2370 = this->map_uint64_uint64_val_;
  local_2368 = this->map_sint32_sint32_key_;
  local_2360 = this->map_sint32_sint32_val_;
  local_2358 = this->map_sint64_sint64_key_;
  local_2350 = this->map_sint64_sint64_val_;
  local_2348 = this->map_fixed32_fixed32_key_;
  local_2340 = this->map_fixed32_fixed32_val_;
  local_2338 = this->map_fixed64_fixed64_key_;
  local_2330 = this->map_fixed64_fixed64_val_;
  local_2328 = this->map_sfixed32_sfixed32_key_;
  local_2320 = this->map_sfixed32_sfixed32_val_;
  local_2318 = this->map_sfixed64_sfixed64_key_;
  local_2310 = this->map_sfixed64_sfixed64_val_;
  local_2308 = this->map_int32_float_key_;
  local_2300 = this->map_int32_float_val_;
  local_22f8 = this->map_int32_double_key_;
  local_22f0 = this->map_int32_double_val_;
  local_22e8 = this->map_bool_bool_key_;
  local_22e0 = this->map_bool_bool_val_;
  local_22d8 = this->map_string_string_key_;
  local_22d0 = this->map_string_string_val_;
  local_22c8 = this->map_int32_bytes_key_;
  local_22c0 = this->map_int32_bytes_val_;
  local_22b8 = this->map_int32_enum_key_;
  local_22b0 = this->map_int32_enum_val_;
  local_22a8 = this->map_int32_foreign_message_key_;
  local_22a0 = this->map_int32_foreign_message_val_;
  local_2298 = &local_23a8;
  local_2290 = 0x22;
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)((long)&__range2 + 7));
  __l._M_len = local_2290;
  __l._M_array = local_2298;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_2288,__l,
           (allocator<const_google::protobuf::FieldDescriptor_*> *)((long)&__range2 + 7));
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)((long)&__range2 + 7));
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_2288);
  fdesc = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_2288);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&fdesc);
    if (!bVar1) {
      long_string_abi_cxx11_();
      local_24b8 = std::__cxx11::string::capacity();
      std::__cxx11::string::string(local_2500);
      local_24e0 = std::__cxx11::string::capacity();
      testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
                ((internal *)local_24b0,"long_string().capacity()","std::string().capacity()",
                 &local_24b8,&local_24e0);
      std::__cxx11::string::~string(local_2500);
      std::__cxx11::string::~string(local_24d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24b0);
      if (!bVar1) {
        testing::Message::Message(&local_2508);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_24b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xbe,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2508)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_2508);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_24b0);
      long_string_2_abi_cxx11_();
      local_2528 = std::__cxx11::string::capacity();
      std::__cxx11::string::string(local_2570);
      local_2550 = std::__cxx11::string::capacity();
      testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
                ((internal *)local_2520,"long_string_2().capacity()","std::string().capacity()",
                 &local_2528,&local_2550);
      std::__cxx11::string::~string(local_2570);
      std::__cxx11::string::~string(local_2548);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2520);
      if (!bVar1) {
        testing::Message::Message(&local_2578);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2520);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xbf,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2580,&local_2578);
        testing::internal::AssertHelper::~AssertHelper(&local_2580);
        testing::Message::~Message(&local_2578);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2520);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_2288);
      return;
    }
    ppFVar6 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    local_23d0 = *ppFVar6;
    pDVar7 = FieldDescriptor::containing_type(local_23d0);
    if (pDVar7 == (Descriptor *)0x0) break;
    sVar9 = FieldDescriptor::name(local_23d0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"key");
    bVar1 = std::operator==(sVar9,stack0xffffffffffffdbe0);
    if (bVar1) {
      pDVar7 = FieldDescriptor::containing_type(local_23d0);
      local_2438 = Descriptor::map_key(pDVar7);
      testing::internal::EqHelper::
      Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
                ((EqHelper *)local_2430,"fdesc->containing_type()->map_key()","fdesc",&local_2438,
                 &local_23d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2430);
      if (!bVar1) {
        testing::Message::Message(&local_2440);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2430);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xb6,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2440)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_2440);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2430);
    }
    else {
      sVar9 = FieldDescriptor::name(local_23d0);
      local_2468 = sVar9;
      testing::internal::EqHelper::
      Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[6],_nullptr>
                ((EqHelper *)local_2458,"fdesc->name()","\"value\"",&local_2468,
                 (char (*) [6])0x7573b3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2458);
      if (!bVar1) {
        testing::Message::Message(&local_2470);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2458);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xb8,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2470)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_2470);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2458);
      pDVar7 = FieldDescriptor::containing_type(local_23d0);
      local_2490 = Descriptor::map_value(pDVar7);
      testing::internal::EqHelper::
      Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
                ((EqHelper *)local_2488,"fdesc->containing_type()->map_value()","fdesc",&local_2490,
                 &local_23d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2488);
      if (!bVar1) {
        testing::Message::Message(&local_2498);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2488);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0xb9,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2498)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_2498);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2488);
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_23e8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
             ,0xb4,"fdesc->containing_type() != nullptr");
  pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_23e8);
  sVar9 = FieldDescriptor::name(local_23d0);
  pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,sVar9);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_23d1,pLVar8);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&local_23e8);
}

Assistant:

MapReflectionTester::MapReflectionTester(const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();

  map_enum_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_FOO"));
  map_enum_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_BAR"));
  map_enum_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".MAP_ENUM_BAZ"));

  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  map_int32_int32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32Int32Entry.key"));
  map_int32_int32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32Int32Entry.value"));
  map_int64_int64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt64Int64Entry.key"));
  map_int64_int64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt64Int64Entry.value"));
  map_uint32_uint32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint32Uint32Entry.key"));
  map_uint32_uint32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint32Uint32Entry.value"));
  map_uint64_uint64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint64Uint64Entry.key"));
  map_uint64_uint64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapUint64Uint64Entry.value"));
  map_sint32_sint32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint32Sint32Entry.key"));
  map_sint32_sint32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint32Sint32Entry.value"));
  map_sint64_sint64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint64Sint64Entry.key"));
  map_sint64_sint64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSint64Sint64Entry.value"));
  map_fixed32_fixed32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed32Fixed32Entry.key"));
  map_fixed32_fixed32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed32Fixed32Entry.value"));
  map_fixed64_fixed64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed64Fixed64Entry.key"));
  map_fixed64_fixed64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapFixed64Fixed64Entry.value"));
  map_sfixed32_sfixed32_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed32Sfixed32Entry.key"));
  map_sfixed32_sfixed32_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed32Sfixed32Entry.value"));
  map_sfixed64_sfixed64_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed64Sfixed64Entry.key"));
  map_sfixed64_sfixed64_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapSfixed64Sfixed64Entry.value"));
  map_int32_float_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32FloatEntry.key"));
  map_int32_float_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32FloatEntry.value"));
  map_int32_double_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32DoubleEntry.key"));
  map_int32_double_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32DoubleEntry.value"));
  map_bool_bool_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapBoolBoolEntry.key"));
  map_bool_bool_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapBoolBoolEntry.value"));
  map_string_string_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapStringStringEntry.key"));
  map_string_string_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapStringStringEntry.value"));
  map_int32_bytes_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32BytesEntry.key"));
  map_int32_bytes_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32BytesEntry.value"));
  map_int32_enum_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32EnumEntry.key"));
  map_int32_enum_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32EnumEntry.value"));
  map_int32_foreign_message_key_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32ForeignMessageEntry.key"));
  map_int32_foreign_message_val_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestMap.MapInt32ForeignMessageEntry.value"));

  EXPECT_FALSE(map_enum_foo_ == nullptr);
  EXPECT_FALSE(map_enum_bar_ == nullptr);
  EXPECT_FALSE(map_enum_baz_ == nullptr);
  EXPECT_FALSE(map_int32_int32_key_ == nullptr);
  EXPECT_FALSE(map_int32_int32_val_ == nullptr);
  EXPECT_FALSE(map_int64_int64_key_ == nullptr);
  EXPECT_FALSE(map_int64_int64_val_ == nullptr);
  EXPECT_FALSE(map_uint32_uint32_key_ == nullptr);
  EXPECT_FALSE(map_uint32_uint32_val_ == nullptr);
  EXPECT_FALSE(map_uint64_uint64_key_ == nullptr);
  EXPECT_FALSE(map_uint64_uint64_val_ == nullptr);
  EXPECT_FALSE(map_sint32_sint32_key_ == nullptr);
  EXPECT_FALSE(map_sint32_sint32_val_ == nullptr);
  EXPECT_FALSE(map_sint64_sint64_key_ == nullptr);
  EXPECT_FALSE(map_sint64_sint64_val_ == nullptr);
  EXPECT_FALSE(map_fixed32_fixed32_key_ == nullptr);
  EXPECT_FALSE(map_fixed32_fixed32_val_ == nullptr);
  EXPECT_FALSE(map_fixed64_fixed64_key_ == nullptr);
  EXPECT_FALSE(map_fixed64_fixed64_val_ == nullptr);
  EXPECT_FALSE(map_sfixed32_sfixed32_key_ == nullptr);
  EXPECT_FALSE(map_sfixed32_sfixed32_val_ == nullptr);
  EXPECT_FALSE(map_sfixed64_sfixed64_key_ == nullptr);
  EXPECT_FALSE(map_sfixed64_sfixed64_val_ == nullptr);
  EXPECT_FALSE(map_int32_float_key_ == nullptr);
  EXPECT_FALSE(map_int32_float_val_ == nullptr);
  EXPECT_FALSE(map_int32_double_key_ == nullptr);
  EXPECT_FALSE(map_int32_double_val_ == nullptr);
  EXPECT_FALSE(map_bool_bool_key_ == nullptr);
  EXPECT_FALSE(map_bool_bool_val_ == nullptr);
  EXPECT_FALSE(map_string_string_key_ == nullptr);
  EXPECT_FALSE(map_string_string_val_ == nullptr);
  EXPECT_FALSE(map_int32_bytes_key_ == nullptr);
  EXPECT_FALSE(map_int32_bytes_val_ == nullptr);
  EXPECT_FALSE(map_int32_enum_key_ == nullptr);
  EXPECT_FALSE(map_int32_enum_val_ == nullptr);
  EXPECT_FALSE(map_int32_foreign_message_key_ == nullptr);
  EXPECT_FALSE(map_int32_foreign_message_val_ == nullptr);

  std::vector<const FieldDescriptor*> all_map_descriptors = {
      map_int32_int32_key_,
      map_int32_int32_val_,
      map_int64_int64_key_,
      map_int64_int64_val_,
      map_uint32_uint32_key_,
      map_uint32_uint32_val_,
      map_uint64_uint64_key_,
      map_uint64_uint64_val_,
      map_sint32_sint32_key_,
      map_sint32_sint32_val_,
      map_sint64_sint64_key_,
      map_sint64_sint64_val_,
      map_fixed32_fixed32_key_,
      map_fixed32_fixed32_val_,
      map_fixed64_fixed64_key_,
      map_fixed64_fixed64_val_,
      map_sfixed32_sfixed32_key_,
      map_sfixed32_sfixed32_val_,
      map_sfixed64_sfixed64_key_,
      map_sfixed64_sfixed64_val_,
      map_int32_float_key_,
      map_int32_float_val_,
      map_int32_double_key_,
      map_int32_double_val_,
      map_bool_bool_key_,
      map_bool_bool_val_,
      map_string_string_key_,
      map_string_string_val_,
      map_int32_bytes_key_,
      map_int32_bytes_val_,
      map_int32_enum_key_,
      map_int32_enum_val_,
      map_int32_foreign_message_key_,
      map_int32_foreign_message_val_};
  for (const FieldDescriptor* fdesc : all_map_descriptors) {
    ABSL_CHECK(fdesc->containing_type() != nullptr) << fdesc->name();
    if (fdesc->name() == "key") {
      EXPECT_EQ(fdesc->containing_type()->map_key(), fdesc);
    } else {
      EXPECT_EQ(fdesc->name(), "value");
      EXPECT_EQ(fdesc->containing_type()->map_value(), fdesc);
    }
  }

  // Must be heap allocated.
  EXPECT_NE(long_string().capacity(), std::string().capacity());
  EXPECT_NE(long_string_2().capacity(), std::string().capacity());
}